

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

void __thiscall LexerTest_LexParens_Test::~LexerTest_LexParens_Test(LexerTest_LexParens_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, LexParens) {
  Lexer lexer("(())"sv);

  ASSERT_FALSE(lexer.empty());
  EXPECT_TRUE(lexer.takeLParen());

  ASSERT_FALSE(lexer.empty());
  EXPECT_TRUE(lexer.takeLParen());

  ASSERT_FALSE(lexer.empty());
  EXPECT_TRUE(lexer.takeRParen());

  ASSERT_FALSE(lexer.empty());
  EXPECT_TRUE(lexer.takeRParen());

  EXPECT_TRUE(lexer.empty());
}